

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O3

int process_start(char *name,char *part,process_info_t *p,int is_helper)

{
  int iVar1;
  uint uVar2;
  __pid_t _Var3;
  int iVar4;
  char *pcVar5;
  FILE *__stream;
  ssize_t sVar6;
  int *piVar7;
  ulong uVar8;
  uint extraout_EDX;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int pipefd [2];
  char fdstr [8];
  char *args [16];
  int aiStack_208 [2];
  ulong uStack_200;
  uint uStack_1f8;
  timeval tStack_1f0;
  timeval tStack_1d8;
  pthread_t pStack_1c8;
  fd_set fStack_1c0;
  pthread_attr_t pStack_140;
  ulong uStack_108;
  FILE *pFStack_100;
  char *pcStack_f8;
  process_info_t *ppStack_f0;
  char *pcStack_e8;
  code *pcStack_e0;
  int local_cc;
  uint local_c8;
  uint local_c4;
  char local_c0 [8];
  char *local_b8 [17];
  
  pcStack_e0 = (code *)0x15230a;
  pcVar5 = getenv("UV_USE_VALGRIND");
  local_c4 = 0;
  if (pcVar5 != (char *)0x0 && is_helper == 0) {
    pcStack_e0 = (code *)0x152324;
    iVar1 = atoi(pcVar5);
    local_c4 = 0;
    if (iVar1 != 0) {
      local_b8[0] = "valgrind";
      local_b8[1] = "--quiet";
      local_b8[2] = "--leak-check=full";
      local_b8[3] = "--show-reachable=yes";
      local_b8[4] = "--error-exitcode=125";
      local_c4 = 5;
    }
  }
  uVar8 = (ulong)(local_c4 * 8);
  *(char **)((long)local_b8 + uVar8) = executable_path;
  *(char **)((long)local_b8 + uVar8 + 8) = name;
  local_b8[(ulong)local_c4 + 2] = part;
  local_c4 = local_c4 + 4;
  pcVar5 = (char *)(ulong)local_c4;
  *(undefined8 *)((long)local_b8 + uVar8 + 0x18) = 0;
  pcStack_e0 = (code *)0x1523a2;
  __stream = tmpfile64();
  pcStack_e0 = (code *)0x1523ad;
  uVar2 = fileno(__stream);
  if (__stream == (FILE *)0x0) {
    pcVar5 = "tmpfile";
    goto LAB_001524c2;
  }
  if (is_helper != 0) {
    pcStack_e0 = (code *)0x1523c6;
    iVar1 = pipe(&local_cc);
    if (iVar1 != 0) {
      pcVar5 = "pipe";
      goto LAB_001524c2;
    }
    pcVar5 = local_c0;
    pcStack_e0 = (code *)0x1523ed;
    snprintf(pcVar5,8,"%d",(ulong)local_c8);
    pcStack_e0 = (code *)0x152401;
    iVar1 = setenv("UV_TEST_RUNNER_FD",pcVar5,1);
    if (iVar1 != 0) {
      pcVar5 = "setenv";
      goto LAB_001524c2;
    }
  }
  p->status = 0;
  p->terminated = 0;
  pcStack_e0 = (code *)0x152416;
  _Var3 = fork();
  if (_Var3 < 0) {
    pcVar5 = "fork";
LAB_001524c2:
    pcStack_e0 = (code *)0x1524c7;
    perror(pcVar5);
    return -1;
  }
  if (_Var3 != 0) {
    p->pid = _Var3;
    pcStack_e0 = (code *)0x152430;
    pcVar5 = strdup(name);
    p->name = pcVar5;
    p->stdout_file = (FILE *)__stream;
    if (is_helper == 0) {
      return 0;
    }
    pcStack_e0 = (code *)0x15244a;
    closefd(local_c8);
    pcStack_e0 = (code *)0x152456;
    unsetenv("UV_TEST_RUNNER_FD");
    do {
      pcStack_e0 = (code *)0x15246c;
      sVar6 = read(local_cc,&local_c4,1);
      if (sVar6 != -1) {
        pcStack_e0 = (code *)0x152494;
        closefd(local_cc);
        if (0 < sVar6) {
          pcStack_e0 = (code *)0x15249e;
          process_start_cold_1();
          return -1;
        }
        return 0;
      }
      pcStack_e0 = (code *)0x152477;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    pcStack_e0 = (code *)0x152486;
    process_start_cold_2();
    return -1;
  }
  uVar8 = (ulong)(is_helper == 0);
  uVar10 = (uint)&local_cc;
  pcStack_e0 = process_wait;
  process_start_cold_3();
  aiStack_208[0] = -1;
  aiStack_208[1] = -1;
  uStack_200 = uVar8;
  uStack_1f8 = uVar10;
  uStack_108 = (ulong)(uint)is_helper;
  pFStack_100 = __stream;
  pcStack_f8 = pcVar5;
  ppStack_f0 = p;
  pcStack_e8 = name;
  pcStack_e0 = (code *)(ulong)uVar2;
  if (extraout_EDX == 0xffffffff) {
    dowait(aiStack_208);
    iVar1 = 0;
  }
  else {
    iVar1 = pipe(aiStack_208);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_init(&pStack_140);
      if ((iVar1 == 0) && (iVar1 = pthread_attr_setstacksize(&pStack_140,0x40000), iVar1 == 0)) {
        iVar1 = pthread_create(&pStack_1c8,&pStack_140,dowait,aiStack_208);
        iVar4 = pthread_attr_destroy(&pStack_140);
        if (iVar4 == 0) {
          if (iVar1 != 0) {
            perror("pthread_create()");
            iVar1 = -1;
LAB_00152762:
            close(aiStack_208[0]);
            close(aiStack_208[1]);
            return iVar1;
          }
          iVar1 = gettimeofday(&tStack_1d8,(__timezone_ptr_t)0x0);
          if (iVar1 == 0) {
            tStack_1f0.tv_sec = tStack_1d8.tv_sec;
            tStack_1f0.tv_usec = tStack_1d8.tv_usec;
            while( true ) {
              if ((tStack_1f0.tv_sec <= tStack_1d8.tv_sec) &&
                 ((tStack_1f0.tv_sec != tStack_1d8.tv_sec ||
                  (tStack_1f0.tv_usec < tStack_1d8.tv_usec)))) {
                __assert_fail("tv.tv_sec > timebase.tv_sec || (tv.tv_sec == timebase.tv_sec && tv.tv_usec >= timebase.tv_usec)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/runner-unix.c"
                              ,0x122,"int process_wait(process_info_t *, int, int)");
              }
              uVar9 = ((int)(SUB168(SEXT816(tStack_1f0.tv_usec) * SEXT816(0x20c49ba5e353f7cf),8) >>
                            7) -
                      (SUB164(SEXT816(tStack_1f0.tv_usec) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f
                      )) + ((int)(SUB168(SEXT816(tStack_1d8.tv_usec) * SEXT816(-0x20c49ba5e353f7cf),
                                         8) >> 7) -
                           (SUB164(SEXT816(tStack_1d8.tv_usec) * SEXT816(-0x20c49ba5e353f7cf),0xc)
                           >> 0x1f)) + ((int)tStack_1f0.tv_sec - (int)tStack_1d8.tv_sec) * 1000;
              uVar2 = extraout_EDX - uVar9;
              if (extraout_EDX < uVar9 || uVar2 == 0) break;
              tStack_1f0.tv_sec = (ulong)uVar2 / 1000;
              tStack_1f0.tv_usec = (__suseconds_t)((uVar2 % 1000) * 1000);
              fStack_1c0.fds_bits[0] = 0;
              fStack_1c0.fds_bits[1] = 0;
              fStack_1c0.fds_bits[2] = 0;
              fStack_1c0.fds_bits[3] = 0;
              fStack_1c0.fds_bits[4] = 0;
              fStack_1c0.fds_bits[5] = 0;
              fStack_1c0.fds_bits[6] = 0;
              fStack_1c0.fds_bits[7] = 0;
              fStack_1c0.fds_bits[8] = 0;
              fStack_1c0.fds_bits[9] = 0;
              fStack_1c0.fds_bits[10] = 0;
              fStack_1c0.fds_bits[0xb] = 0;
              iVar1 = aiStack_208[0] + 0x3f;
              if (-1 < aiStack_208[0]) {
                iVar1 = aiStack_208[0];
              }
              fStack_1c0.fds_bits[0xc] = 0;
              fStack_1c0.fds_bits[0xd] = 0;
              fStack_1c0.fds_bits[0xe] = 0;
              fStack_1c0.fds_bits[0xf] = 0;
              fStack_1c0.fds_bits[iVar1 >> 6] =
                   fStack_1c0.fds_bits[iVar1 >> 6] | 1L << ((byte)(aiStack_208[0] % 0x40) & 0x3f);
              iVar1 = select(aiStack_208[0] + 1,&fStack_1c0,(fd_set *)0x0,(fd_set *)0x0,&tStack_1f0)
              ;
              if (iVar1 != -1) {
                if (iVar1 == 0) break;
                iVar1 = 0;
                goto LAB_00152752;
              }
              piVar7 = __errno_location();
              if (*piVar7 != 4) {
                perror("select()");
                iVar1 = -1;
                goto LAB_00152752;
              }
              iVar1 = gettimeofday(&tStack_1f0,(__timezone_ptr_t)0x0);
              if (iVar1 != 0) goto LAB_00152708;
            }
            iVar1 = -2;
            if (0 < (int)uVar10) {
              lVar11 = 0;
              do {
                kill(*(__pid_t *)(uVar8 + 8 + lVar11),0xf);
                lVar11 = lVar11 + 0x20;
              } while ((ulong)uVar10 << 5 != lVar11);
            }
LAB_00152752:
            iVar4 = pthread_join(pStack_1c8,(void **)0x0);
            if (iVar4 == 0) goto LAB_00152762;
          }
        }
      }
LAB_00152708:
      abort();
    }
    perror("pipe()");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int process_start(char* name, char* part, process_info_t* p, int is_helper) {
  FILE* stdout_file;
  int stdout_fd;
  const char* arg;
  char* args[16];
  int pipefd[2];
  char fdstr[8];
  ssize_t rc;
  int n;
  pid_t pid;

  arg = getenv("UV_USE_VALGRIND");
  n = 0;

  /* Disable valgrind for helpers, it complains about helpers leaking memory.
   * They're killed after the test and as such never get a chance to clean up.
   */
  if (is_helper == 0 && arg != NULL && atoi(arg) != 0) {
    args[n++] = "valgrind";
    args[n++] = "--quiet";
    args[n++] = "--leak-check=full";
    args[n++] = "--show-reachable=yes";
    args[n++] = "--error-exitcode=125";
  }

  args[n++] = executable_path;
  args[n++] = name;
  args[n++] = part;
  args[n++] = NULL;

  stdout_file = tmpfile();
  stdout_fd = fileno(stdout_file);
  if (!stdout_file) {
    perror("tmpfile");
    return -1;
  }

  if (is_helper) {
    if (pipe(pipefd)) {
      perror("pipe");
      return -1;
    }

    snprintf(fdstr, sizeof(fdstr), "%d", pipefd[1]);
    if (setenv("UV_TEST_RUNNER_FD", fdstr, /* overwrite */ 1)) {
      perror("setenv");
      return -1;
    }
  }

  p->terminated = 0;
  p->status = 0;

  pid = fork();

  if (pid < 0) {
    perror("fork");
    return -1;
  }

  if (pid == 0) {
    /* child */
    if (is_helper)
      closefd(pipefd[0]);
    dup2(stdout_fd, STDOUT_FILENO);
    dup2(stdout_fd, STDERR_FILENO);
    execve(args[0], args, environ);
    perror("execve()");
    _exit(127);
  }

  /* parent */
  p->pid = pid;
  p->name = strdup(name);
  p->stdout_file = stdout_file;

  if (!is_helper)
    return 0;

  closefd(pipefd[1]);
  unsetenv("UV_TEST_RUNNER_FD");

  do
    rc = read(pipefd[0], &n, 1);
  while (rc == -1 && errno == EINTR);

  closefd(pipefd[0]);

  if (rc == -1) {
    perror("read");
    return -1;
  }

  if (rc > 0) {
    fprintf(stderr, "EOF expected but got data.\n");
    return -1;
  }

  return 0;
}